

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O1

string * cmInstallTargetGenerator::GetInstallFilename
                   (string *__return_storage_ptr__,cmGeneratorTarget *target,string *config,
                   NameType nameType)

{
  bool bVar1;
  TargetType TVar2;
  string targetNameReal;
  string targetNameSO;
  string targetNameImport;
  string targetName;
  string targetNamePDB;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TVar2 = cmGeneratorTarget::GetType(target);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  if (TVar2 == EXECUTABLE) {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    cmGeneratorTarget::GetExecutableNames(target,&local_78,&local_b8,&local_d8,&local_98,config);
    if (((nameType == NameReal) || (nameType != NameImplib)) ||
       (bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                          (target,&local_d8,__return_storage_ptr__,"${CMAKE_IMPORT_LIBRARY_SUFFIX}")
       , !bVar1)) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_00441b41;
  }
  else {
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    cmGeneratorTarget::GetLibraryNames
              (target,&local_78,&local_b8,&local_d8,&local_98,&local_50,config);
    if (((nameType == NameReal) || (nameType == NameSO)) ||
       ((nameType != NameImplib ||
        (bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                           (target,&local_98,__return_storage_ptr__,"${CMAKE_IMPORT_LIBRARY_SUFFIX}"
                           ), !bVar1)))) {
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_00441b41;
  }
  operator_delete(local_98._M_dataplus._M_p,
                  CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                           local_98.field_2._M_local_buf[0]) + 1);
LAB_00441b41:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallTargetGenerator::GetInstallFilename(
  cmGeneratorTarget const* target, const std::string& config,
  NameType nameType)
{
  std::string fname;
  // Compute the name of the library.
  if (target->GetType() == cmStateEnums::EXECUTABLE) {
    std::string targetName;
    std::string targetNameReal;
    std::string targetNameImport;
    std::string targetNamePDB;
    target->GetExecutableNames(targetName, targetNameReal, targetNameImport,
                               targetNamePDB, config);
    if (nameType == NameImplib) {
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(targetNameImport, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = targetNameImport;
      }
    } else if (nameType == NameReal) {
      // Use the canonical name.
      fname = targetNameReal;
    } else {
      // Use the canonical name.
      fname = targetName;
    }
  } else {
    std::string targetName;
    std::string targetNameSO;
    std::string targetNameReal;
    std::string targetNameImport;
    std::string targetNamePDB;
    target->GetLibraryNames(targetName, targetNameSO, targetNameReal,
                            targetNameImport, targetNamePDB, config);
    if (nameType == NameImplib) {
      // Use the import library name.
      if (!target->GetImplibGNUtoMS(targetNameImport, fname,
                                    "${CMAKE_IMPORT_LIBRARY_SUFFIX}")) {
        fname = targetNameImport;
      }
    } else if (nameType == NameSO) {
      // Use the soname.
      fname = targetNameSO;
    } else if (nameType == NameReal) {
      // Use the real name.
      fname = targetNameReal;
    } else {
      // Use the canonical name.
      fname = targetName;
    }
  }

  return fname;
}